

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O0

void dsdKernelCopyListPlusOne(Dsd_Node_t *p,Dsd_Node_t *First,Dsd_Node_t **ppList,int nListSize)

{
  int local_28;
  int i;
  int nListSize_local;
  Dsd_Node_t **ppList_local;
  Dsd_Node_t *First_local;
  Dsd_Node_t *p_local;
  
  if (nListSize + 1 == (int)p->nDecs) {
    *p->pDecs = First;
    for (local_28 = 0; local_28 < nListSize; local_28 = local_28 + 1) {
      p->pDecs[local_28 + 1] = ppList[local_28];
    }
    return;
  }
  __assert_fail("nListSize+1 == p->nDecs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdProc.c"
                ,0x5f1,
                "void dsdKernelCopyListPlusOne(Dsd_Node_t *, Dsd_Node_t *, Dsd_Node_t **, int)");
}

Assistant:

void dsdKernelCopyListPlusOne( Dsd_Node_t * p, Dsd_Node_t * First, Dsd_Node_t ** ppList, int nListSize )
{
    int i;
    assert( nListSize+1 == p->nDecs );
    p->pDecs[0] = First;
    for( i = 0; i < nListSize; i++ )
        p->pDecs[i+1] = ppList[i];
}